

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::AddLabel(PrintVisitor *this,string *label)

{
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)label);
  ConstructLabel(&local_50,(PrintVisitor *)label,&local_30,this->lastVisited + 1);
  std::__cxx11::string::append((string *)&this->description);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void IRT::PrintVisitor::AddLabel( std::string label ) {
    this->description += ConstructLabel( label, lastVisited + 1 );
}